

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O2

int Abc_NtkToAig(Abc_Ntk_t *pNtk)

{
  int iVar1;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    __assert_fail("!Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x4dc,"int Abc_NtkToAig(Abc_Ntk_t *)");
  }
  switch(pNtk->ntkFunc) {
  case ABC_FUNC_SOP:
    break;
  case ABC_FUNC_BDD:
    iVar1 = Abc_NtkBddToSop(pNtk,-1,1000000000);
    if (iVar1 == 0) {
      return 0;
    }
    break;
  case ABC_FUNC_AIG:
  case ABC_FUNC_BLACKBOX:
    return 1;
  case ABC_FUNC_MAP:
    Abc_NtkMapToSop(pNtk);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x4ee,"int Abc_NtkToAig(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkSopToAig(pNtk);
  return iVar1;
}

Assistant:

int Abc_NtkToAig( Abc_Ntk_t * pNtk )
{
    assert( !Abc_NtkIsStrash(pNtk) );
    if ( Abc_NtkHasBlackbox(pNtk) )
        return 1;
    if ( Abc_NtkHasAig(pNtk) )
        return 1;
    if ( Abc_NtkHasMapping(pNtk) )
    {
        Abc_NtkMapToSop(pNtk);
        return Abc_NtkSopToAig(pNtk);
    }
    if ( Abc_NtkHasBdd(pNtk) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
            return 0;
        return Abc_NtkSopToAig(pNtk);
    }
    if ( Abc_NtkHasSop(pNtk) )
        return Abc_NtkSopToAig(pNtk);
    assert( 0 );
    return 0;
}